

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  ostream *poVar6;
  char *pcVar7;
  bool bVar8;
  AssertionStats *pAVar9;
  pointer pMVar10;
  Colour colourGuard_3;
  ConsoleAssertionPrinter printer;
  Colour colourGuard_1;
  Colour colourGuard;
  char local_129;
  ostream *local_128;
  AssertionStats *local_120;
  AssertionResult *local_118;
  Code local_110;
  char *local_108;
  char *local_100;
  char local_f8;
  undefined7 uStack_f7;
  char *local_e8;
  char *local_e0;
  char local_d8;
  undefined7 uStack_d7;
  long *local_c8 [2];
  long local_b8 [2];
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> local_a8;
  byte local_90;
  undefined1 local_88 [32];
  size_t local_68;
  string local_58;
  ConsoleReporter *local_38;
  
  pAVar9 = _assertionStats;
  iVar4 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_90 = 1;
  if ((char)iVar4 == '\0') {
    local_90 = ((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
               (byte)(char)(_assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  bVar8 = (bool)((_assertionStats->assertionResult).m_resultData.resultType == Warning | local_90);
  if (bVar8 != true) {
    return bVar8;
  }
  TablePrinter::close((this->m_tablePrinter)._M_t.
                      super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                      .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,(int)pAVar9)
  ;
  lazyPrintWithoutClosingBenchmarkTable(this);
  local_128 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  local_108 = &local_f8;
  local_110 = None;
  local_100 = (char *)0x0;
  local_f8 = '\0';
  local_e8 = &local_d8;
  local_e0 = (char *)0x0;
  local_d8 = '\0';
  local_c8[0] = local_b8;
  pcVar2 = (_assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_120 = _assertionStats;
  local_118 = &_assertionStats->assertionResult;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar2,
             pcVar2 + (_assertionStats->assertionResult).m_resultData.message._M_string_length);
  local_38 = this;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&local_a8,&_assertionStats->infoMessages);
  OVar1 = (local_118->m_resultData).resultType;
  if (ExpressionFailed < OVar1) {
    if (OVar1 < ThrewException) {
      if (OVar1 != ExplicitFailure) {
        if (OVar1 != Exception) goto LAB_0012ce43;
        goto switchD_0012cb04_caseD_ffffffff;
      }
      std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x177d72);
      local_110 = BrightRed;
      if ((long)(_assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(_assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start == 0x48) {
        std::__cxx11::string::_M_replace((ulong)&local_e8,0,local_e0,0x1790c0);
      }
      if ((ulong)(((long)(_assertionStats->infoMessages).
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(_assertionStats->infoMessages).
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 2)
      goto LAB_0012ce43;
      pcVar7 = "explicitly with messages";
    }
    else {
      if (OVar1 == ThrewException) {
        local_110 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x177d72);
        std::__cxx11::string::_M_replace((ulong)&local_e8,0,local_e0,0x179048);
        if ((long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0x48) {
          std::__cxx11::string::append((char *)&local_e8);
        }
        if (1 < (ulong)(((long)(_assertionStats->infoMessages).
                               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(_assertionStats->infoMessages).
                               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7
                       )) {
          std::__cxx11::string::append((char *)&local_e8);
        }
        goto LAB_0012ce43;
      }
      if (OVar1 == DidntThrowException) {
        local_110 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x177d72);
        pcVar7 = "because no exception was thrown where one was expected";
      }
      else {
        if (OVar1 != FatalErrorCondition) goto LAB_0012ce43;
        local_110 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x177d72);
        pcVar7 = "due to a fatal error condition";
      }
    }
    goto LAB_0012ce34;
  }
  switch(OVar1) {
  case Ok:
    local_110 = Green;
    std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x17902d);
    if ((long)(_assertionStats->infoMessages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(_assertionStats->infoMessages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_start == 0x48) {
      std::__cxx11::string::_M_replace((ulong)&local_e8,0,local_e0,0x1790cb);
    }
LAB_0012cc4f:
    if ((ulong)(((long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 2)
    goto LAB_0012ce43;
    pcVar7 = "with messages";
    break;
  case Info:
    pcVar7 = "info";
    break;
  case Warning:
    pcVar7 = "warning";
    break;
  case Unknown:
    goto switchD_0012cb04_caseD_ffffffff;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 != ExpressionFailed) goto LAB_0012ce43;
      bVar8 = (char)(((local_118->m_info).resultDisposition & SuppressFail) >> 3) != '\0';
      local_110 = BrightRed;
      if (bVar8) {
        local_110 = Green;
      }
      pcVar7 = "FAILED";
      if (bVar8) {
        pcVar7 = "FAILED - but was ok";
      }
      std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,(ulong)pcVar7);
      if ((long)(_assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(_assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start == 0x48) {
        std::__cxx11::string::_M_replace((ulong)&local_e8,0,local_e0,0x1790cb);
      }
      goto LAB_0012cc4f;
    }
    goto switchD_0012cb04_caseD_ffffffff;
  }
LAB_0012ce34:
  std::__cxx11::string::_M_replace((ulong)&local_e8,0,local_e0,(ulong)pcVar7);
LAB_0012ce43:
  local_58._M_dataplus._M_p._0_1_ = 0;
  Colour::use(FileName);
  poVar6 = local_128;
  local_88._0_8_ = (local_118->m_info).lineInfo.file;
  local_88._8_8_ = (local_118->m_info).lineInfo.line;
  operator<<(local_128,(SourceLineInfo *)local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,": ",2);
  Colour::use(None);
  if ((local_120->totals).assertions.failed + (local_120->totals).assertions.passed +
      (local_120->totals).assertions.failedButOk == 0) {
    local_88[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,local_88,1);
  }
  else {
    if (local_100 != (char *)0x0) {
      local_88._0_8_ = (ulong)(uint7)local_88._1_7_ << 8;
      Colour::use(local_110);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_128,local_108,(long)local_100);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
      Colour::use(None);
    }
    if ((local_118->m_info).capturedExpression.m_size != 0) {
      local_58._M_dataplus._M_p._0_1_ = 0;
      Colour::use(Cyan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,"  ",2);
      poVar6 = local_128;
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)local_88,local_118);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar6,(char *)local_88._0_8_,local_88._8_8_);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      local_88[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,local_88,1);
      Colour::use(None);
    }
    bVar8 = AssertionResult::hasExpandedExpression(local_118);
    if (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_128,"with expansion:\n",0x10);
      Colour::use(BrightYellow);
      poVar6 = local_128;
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_58,local_118);
      clara::TextFlow::Column::Column((Column *)local_88,&local_58);
      local_68 = 2;
      poVar6 = clara::TextFlow::operator<<(poVar6,(Column *)local_88);
      local_129 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,&local_129,1);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
          &local_58.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                        local_58.field_2._M_allocated_capacity + 1);
      }
      Colour::use(None);
    }
  }
  if (local_e0 != (char *)0x0) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_128,local_e8,(long)local_e0);
    local_88[0] = ':';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_88,1);
    local_88[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_88,1);
  }
  if (local_a8.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar10 = local_a8.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      poVar6 = local_128;
      if ((local_90 != 0) || (pMVar10->type != Info)) {
        clara::TextFlow::Column::Column((Column *)local_88,&pMVar10->message);
        local_68 = 2;
        poVar6 = clara::TextFlow::operator<<(poVar6,(Column *)local_88);
        local_58._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,(char *)&local_58,1);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88);
      }
      pMVar10 = pMVar10 + 1;
    } while (pMVar10 !=
             local_a8.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  poVar6 = (local_38->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  cVar3 = (char)poVar6;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&local_a8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  return true;
switchD_0012cb04_caseD_ffffffff:
  std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x178f17);
  local_110 = BrightRed;
  goto LAB_0012ce43;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    if (!includeResults && result.getResultType() != ResultWas::Warning)
        return false;

    lazyPrint();

    ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
    printer.print();
    stream << std::endl;
    return true;
}